

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void vk::BinaryRegistryDetail::anon_unknown_8::normalizeSparseIndex(SparseIndexNode *group)

{
  vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  *this;
  SparseIndexNode *pSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  value_type local_28;
  
  this = &group->children;
  ppSVar2 = (group->children).
            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0xffffffffffffffff;
  uVar8 = 0;
  while( true ) {
    ppSVar3 = (group->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)ppSVar3 - (long)ppSVar2 >> 3;
    if (uVar7 <= uVar8) break;
    normalizeSparseIndex(ppSVar2[uVar8]);
    ppSVar2 = (this->
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2[uVar8]->word == 0) {
      uVar6 = uVar8;
    }
    uVar6 = uVar6 & 0xffffffff;
    uVar8 = uVar8 + 1;
  }
  if ((int)uVar6 < 0) {
    if (ppSVar2 != ppSVar3) {
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::reserve(this,uVar7 + 1);
      local_28 = (value_type)operator_new(0x20);
      local_28->word = 0;
      local_28->index = 0;
      (local_28->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_28->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_28->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::push_back(this,&local_28);
    }
  }
  else {
    while (iVar4 = (int)uVar6, iVar4 != (int)((ulong)((long)ppSVar3 - (long)ppSVar2) >> 3) + -1) {
      uVar5 = iVar4 + 1;
      pSVar1 = ppSVar2[iVar4];
      ppSVar2[iVar4] = ppSVar2[(int)uVar5];
      ppSVar2[(int)uVar5] = pSVar1;
      ppSVar2 = (group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar3 = (group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (ulong)uVar5;
    }
  }
  return;
}

Assistant:

void normalizeSparseIndex (SparseIndexNode* group)
{
	int		zeroChildPos	= -1;

	for (size_t childNdx = 0; childNdx < group->children.size(); childNdx++)
	{
		normalizeSparseIndex(group->children[childNdx]);

		if (group->children[childNdx]->word == 0)
		{
			DE_ASSERT(zeroChildPos < 0);
			zeroChildPos = (int)childNdx;
		}
	}

	if (zeroChildPos >= 0)
	{
		// Move child with word = 0 to last
		while (zeroChildPos != (int)group->children.size()-1)
		{
			std::swap(group->children[zeroChildPos], group->children[zeroChildPos+1]);
			zeroChildPos += 1;
		}
	}
	else if (!group->children.empty())
	{
		group->children.reserve(group->children.size()+1);
		group->children.push_back(new SparseIndexNode(0, 0));
	}
}